

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O2

int arkLsDenseDQJac(realtype t,N_Vector y,N_Vector fy,SUNMatrix Jac,ARKodeMem ark_mem,
                   ARKLsMem arkls_mem,ARKRhsFn fi,N_Vector tmp1)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  int iVar4;
  N_Vector v;
  realtype *prVar5;
  realtype *prVar6;
  realtype *v_data;
  ulong uVar7;
  realtype rVar8;
  double dVar9;
  double dVar10;
  double local_a8;
  realtype *local_a0;
  double local_90;
  
  uVar3 = SUNDenseMatrix_Columns(Jac);
  v = N_VCloneEmpty(tmp1);
  prVar5 = N_VGetArrayPointer(ark_mem->ewt);
  prVar6 = N_VGetArrayPointer(y);
  if (ark_mem->constraintsSet == 0) {
    local_a0 = (realtype *)0x0;
  }
  else {
    local_a0 = N_VGetArrayPointer(ark_mem->constraints);
  }
  dVar1 = ark_mem->uround;
  local_a8 = 0.0;
  if (0.0 < dVar1) {
    if (dVar1 < 0.0) {
      local_a8 = sqrt(dVar1);
    }
    else {
      local_a8 = SQRT(dVar1);
    }
  }
  rVar8 = N_VWrmsNorm(fy,ark_mem->rwt);
  local_90 = 1.0;
  if ((rVar8 != 0.0) || (NAN(rVar8))) {
    local_90 = rVar8 * (double)(int)uVar3 * ABS(ark_mem->h) * 1000.0 * ark_mem->uround;
  }
  if ((int)uVar3 < 1) {
    uVar3 = 0;
  }
  for (uVar7 = 0; uVar3 != uVar7; uVar7 = uVar7 + 1) {
    v_data = SUNDenseMatrix_Column(Jac,(sunindextype)uVar7);
    N_VSetArrayPointer(v_data,v);
    dVar1 = prVar6[uVar7];
    dVar10 = ABS(dVar1) * local_a8;
    if (ABS(dVar1) * local_a8 <= local_90 / prVar5[uVar7]) {
      dVar10 = local_90 / prVar5[uVar7];
    }
    if (ark_mem->constraintsSet != 0) {
      dVar2 = local_a0[uVar7];
      dVar9 = ABS(dVar2);
      if ((dVar9 != 1.0) || (NAN(dVar9))) {
        if ((dVar9 == 2.0) && ((!NAN(dVar9) && ((dVar1 + dVar10) * dVar2 <= 0.0))))
        goto LAB_004af830;
      }
      else if ((dVar1 + dVar10) * dVar2 < 0.0) {
LAB_004af830:
        dVar10 = -dVar10;
      }
    }
    prVar6[uVar7] = dVar1 + dVar10;
    iVar4 = (*fi)(t,y,tmp1,ark_mem->user_data);
    arkls_mem->nfeDQ = arkls_mem->nfeDQ + 1;
    if (iVar4 != 0) goto LAB_004af8c0;
    prVar6[uVar7] = dVar1;
    N_VLinearSum(1.0 / dVar10,tmp1,-(1.0 / dVar10),fy,v);
  }
  iVar4 = 0;
LAB_004af8c0:
  N_VSetArrayPointer((realtype *)0x0,v);
  N_VDestroy(v);
  return iVar4;
}

Assistant:

int arkLsDenseDQJac(realtype t, N_Vector y, N_Vector fy,
                    SUNMatrix Jac, ARKodeMem ark_mem,
                    ARKLsMem arkls_mem, ARKRhsFn fi,
                    N_Vector tmp1)
{
  realtype     fnorm, minInc, inc, inc_inv, yjsaved, srur, conj;
  realtype    *y_data, *ewt_data, *cns_data;
  N_Vector     ftemp, jthCol;
  sunindextype j, N;
  int          retval = 0;

  /* access matrix dimension */
  N = SUNDenseMatrix_Columns(Jac);

  /* Rename work vector for readibility */
  ftemp = tmp1;

  /* Create an empty vector for matrix column calculations */
  jthCol = N_VCloneEmpty(tmp1);

  /* Obtain pointers to the data for various vectors */
  ewt_data = N_VGetArrayPointer(ark_mem->ewt);
  y_data   = N_VGetArrayPointer(y);
  cns_data = (ark_mem->constraintsSet) ?
    N_VGetArrayPointer(ark_mem->constraints) : NULL;

  /* Set minimum increment based on uround and norm of f */
  srur = SUNRsqrt(ark_mem->uround);
  fnorm = N_VWrmsNorm(fy, ark_mem->rwt);
  minInc = (fnorm != ZERO) ?
    (MIN_INC_MULT * SUNRabs(ark_mem->h) * ark_mem->uround * N * fnorm) : ONE;

  for (j = 0; j < N; j++) {

    /* Generate the jth col of J(tn,y) */
    N_VSetArrayPointer(SUNDenseMatrix_Column(Jac,j), jthCol);

    yjsaved = y_data[j];
    inc = SUNMAX(srur*SUNRabs(yjsaved), minInc/ewt_data[j]);

    /* Adjust sign(inc) if y_j has an inequality constraint. */
    if (ark_mem->constraintsSet) {
      conj = cns_data[j];
      if (SUNRabs(conj) == ONE)      {if ((yjsaved+inc)*conj < ZERO)  inc = -inc;}
      else if (SUNRabs(conj) == TWO) {if ((yjsaved+inc)*conj <= ZERO) inc = -inc;}
    }

    y_data[j] += inc;

    retval = fi(t, y, ftemp, ark_mem->user_data);
    arkls_mem->nfeDQ++;
    if (retval != 0) break;

    y_data[j] = yjsaved;

    inc_inv = ONE/inc;
    N_VLinearSum(inc_inv, ftemp, -inc_inv, fy, jthCol);

  }

  /* Destroy jthCol vector */
  N_VSetArrayPointer(NULL, jthCol);  /* SHOULDN'T BE NEEDED */
  N_VDestroy(jthCol);

  return(retval);
}